

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.cpp
# Opt level: O0

void __thiscall TasGrid::GridLocalPolynomial::clearGpuSurpluses(GridLocalPolynomial *this)

{
  bool bVar1;
  pointer this_00;
  pointer this_01;
  GridLocalPolynomial *this_local;
  
  bVar1 = ::std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->gpu_cache);
  if (bVar1) {
    this_00 = std::
              unique_ptr<TasGrid::CudaLocalPolynomialData<double>,_std::default_delete<TasGrid::CudaLocalPolynomialData<double>_>_>
              ::operator->(&this->gpu_cache);
    GpuVector<double>::clear(&this_00->surpluses);
  }
  bVar1 = ::std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->gpu_cachef);
  if (bVar1) {
    this_01 = std::
              unique_ptr<TasGrid::CudaLocalPolynomialData<float>,_std::default_delete<TasGrid::CudaLocalPolynomialData<float>_>_>
              ::operator->(&this->gpu_cachef);
    GpuVector<float>::clear(&this_01->surpluses);
  }
  return;
}

Assistant:

void GridLocalPolynomial::clearGpuSurpluses(){
    if (gpu_cache) gpu_cache->surpluses.clear();
    if (gpu_cachef) gpu_cachef->surpluses.clear();
}